

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

bool P_IsTIDUsed(int tid)

{
  AActor *pAVar1;
  
  for (pAVar1 = AActor::TIDHash[tid & 0x7f]; (pAVar1 != (AActor *)0x0 && (pAVar1->tid != tid));
      pAVar1 = pAVar1->inext) {
  }
  return pAVar1 != (AActor *)0x0;
}

Assistant:

bool P_IsTIDUsed(int tid)
{
	AActor *probe = AActor::TIDHash[tid & 127];
	while (probe != NULL)
	{
		if (probe->tid == tid)
		{
			return true;
		}
		probe = probe->inext;
	}
	return false;
}